

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  U32 *pUVar5;
  ZSTD_matchState_t *pZVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  char cVar19;
  uint uVar20;
  int iVar21;
  BYTE *pBVar22;
  uint *puVar23;
  long lVar24;
  ulong *puVar25;
  uint *puVar26;
  uint *puVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  BYTE *pBVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  ulong uVar38;
  ulong *puVar39;
  uint uVar40;
  BYTE *pBVar41;
  U32 *pUVar42;
  uint uVar43;
  ulong uVar44;
  bool bVar45;
  BYTE *pInLoopLimit;
  U32 dummy32;
  int local_124;
  BYTE *local_108;
  ulong local_f0;
  int local_a0;
  uint local_60;
  uint local_5c;
  ulong local_58;
  U32 *local_50;
  ulong local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  pUVar42 = ms->hashTable;
  local_48 = (ulong)(mls - 5);
  cVar19 = (char)(ms->cParams).hashLog;
  switch(local_48) {
  case 0:
    lVar24 = -0x30e4432345000000;
    break;
  case 1:
    lVar24 = -0x30e4432340650000;
    break;
  case 2:
    lVar24 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar44 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_00149b21;
  default:
    uVar44 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar19 & 0x1fU));
    goto LAB_00149b26;
  }
  uVar44 = lVar24 * *(long *)ip;
LAB_00149b21:
  uVar44 = uVar44 >> (-cVar19 & 0x3fU);
LAB_00149b26:
  pBVar4 = (ms->window).base;
  uVar28 = (int)ip - (int)pBVar4;
  uVar2 = (ms->window).lowLimit;
  uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar9 = 0;
  uVar30 = uVar28 - uVar35;
  if (uVar28 < uVar35) {
    uVar30 = 0;
  }
  uVar29 = uVar2;
  if (uVar2 < uVar30) {
    uVar29 = uVar30;
  }
  uVar40 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  pUVar5 = ms->chainTable;
  uVar37 = pUVar42[uVar44];
  uVar32 = uVar40;
  if (uVar29 < pUVar42[uVar44]) {
    do {
      uVar20 = uVar37;
      uVar38 = (ulong)((uVar20 & uVar35) * 2);
      if ((pUVar5[uVar38 + 1] != 1) || (uVar32 < 2)) {
        if (pUVar5[uVar38 + 1] == 1) {
          (pUVar5 + uVar38)[0] = 0;
          (pUVar5 + uVar38)[1] = 0;
        }
        uVar20 = uVar9;
        if (uVar9 == 0) goto LAB_00149f9a;
        break;
      }
      pUVar5[uVar38 + 1] = uVar9;
      uVar32 = uVar32 - 1;
      uVar9 = uVar20;
      uVar37 = pUVar5[uVar38];
    } while (uVar29 < pUVar5[uVar38]);
    local_108 = (ms->window).dictBase;
    local_58 = uVar44;
    local_50 = pUVar42;
    do {
      uVar9 = (ms->window).dictLimit;
      uVar44 = (ulong)uVar9;
      puVar39 = (ulong *)iend;
      pBVar41 = pBVar4;
      if (uVar20 < uVar9) {
        puVar39 = (ulong *)(local_108 + uVar44);
        pBVar41 = local_108;
      }
      uVar37 = pUVar5[(ulong)((uVar20 & uVar35) * 2) + 1];
      uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar38 = (ulong)((uVar20 & uVar33) * 2);
      puVar27 = pUVar5 + uVar38;
      puVar26 = pUVar5 + uVar38 + 1;
      if (uVar32 != 0) {
        uVar31 = pUVar5[uVar38];
        uVar3 = (ms->window).lowLimit;
        if (uVar3 < uVar31) {
          local_38 = pBVar4 + uVar44;
          local_40 = pBVar41 + (ulong)uVar20 + 8;
          uVar38 = 0;
          uVar18 = 0;
          uVar43 = uVar32;
          do {
            uVar11 = uVar18;
            if (uVar38 < uVar18) {
              uVar11 = uVar38;
            }
            uVar14 = (ulong)uVar31;
            pBVar22 = pBVar4;
            if (dictMode == ZSTD_extDict) {
              if ((uVar20 < uVar9) || (uVar44 <= uVar14 + uVar11)) {
                if (uVar14 + uVar11 < uVar44) {
                  pBVar22 = local_108;
                }
                goto LAB_00149dcd;
              }
              sVar10 = ZSTD_count_2segments
                                 (pBVar41 + uVar11 + uVar20,local_108 + uVar14 + uVar11,
                                  (BYTE *)puVar39,local_108 + uVar44,local_38);
              uVar11 = sVar10 + uVar11;
              pBVar22 = pBVar4 + uVar14;
              if (uVar11 + uVar14 < uVar44) {
                pBVar22 = local_108 + uVar14;
              }
            }
            else {
LAB_00149dcd:
              puVar25 = (ulong *)(pBVar41 + uVar11 + uVar20);
              puVar17 = (ulong *)(pBVar22 + uVar14 + uVar11);
              puVar13 = puVar25;
              if (puVar25 < (ulong *)((long)puVar39 - 7U)) {
                if (*puVar17 == *puVar25) {
                  lVar24 = 0;
                  do {
                    puVar13 = (ulong *)(local_40 + lVar24 + uVar11);
                    if ((ulong *)((long)puVar39 - 7U) <= puVar13) {
                      puVar17 = (ulong *)(pBVar22 + lVar24 + uVar14 + uVar11 + 8);
                      goto LAB_00149e75;
                    }
                    lVar8 = lVar24 + uVar14 + uVar11 + 8;
                    lVar24 = lVar24 + 8;
                  } while (*(ulong *)(pBVar22 + lVar8) == *puVar13);
                  uVar16 = *puVar13 ^ *(ulong *)(pBVar22 + lVar8);
                  uVar12 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  uVar12 = (uVar12 >> 3 & 0x1fffffff) + lVar24;
                }
                else {
                  uVar16 = *puVar25 ^ *puVar17;
                  uVar12 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  uVar12 = uVar12 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00149e75:
                if ((puVar13 < (ulong *)((long)puVar39 - 3U)) && ((int)*puVar17 == (int)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 4);
                  puVar17 = (ulong *)((long)puVar17 + 4);
                }
                if ((puVar13 < (ulong *)((long)puVar39 + -1)) &&
                   ((short)*puVar17 == (short)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 2);
                  puVar17 = (ulong *)((long)puVar17 + 2);
                }
                if (puVar13 < puVar39) {
                  puVar13 = (ulong *)((long)puVar13 + (ulong)((byte)*puVar17 == (byte)*puVar13));
                }
                uVar12 = (long)puVar13 - (long)puVar25;
              }
              uVar11 = uVar12 + uVar11;
              pBVar22 = pBVar22 + uVar14;
            }
            if ((ulong *)(pBVar41 + uVar11 + uVar20) == puVar39) break;
            puVar23 = pUVar5 + (uVar31 & uVar33) * 2;
            if (pBVar22[uVar11] < (byte)*(ulong *)(pBVar41 + uVar11 + uVar20)) {
              *puVar27 = uVar31;
              if (uVar31 <= uVar29) {
                puVar27 = &local_5c;
                break;
              }
              puVar23 = puVar23 + 1;
              uVar38 = uVar11;
              puVar27 = puVar23;
              uVar11 = uVar18;
            }
            else {
              *puVar26 = uVar31;
              puVar26 = puVar23;
              if (uVar31 <= uVar29) {
                puVar26 = &local_5c;
                break;
              }
            }
            uVar43 = uVar43 - 1;
            if ((uVar43 == 0) || (uVar31 = *puVar23, uVar18 = uVar11, uVar31 <= uVar3)) break;
          } while( true );
        }
      }
      *puVar26 = 0;
      *puVar27 = 0;
      uVar32 = uVar32 + 1;
      pUVar42 = local_50;
      uVar44 = local_58;
      uVar20 = uVar37;
    } while (uVar37 != 0);
  }
  else {
LAB_00149f9a:
    local_108 = (ms->window).dictBase;
  }
  uVar18 = (ulong)(ms->window).dictLimit;
  uVar38 = (ulong)((uVar35 & uVar28) * 2);
  puVar27 = pUVar5 + uVar38;
  puVar26 = pUVar5 + uVar38 + 1;
  local_a0 = uVar28 + 9;
  uVar9 = pUVar42[uVar44];
  pUVar42[uVar44] = uVar28;
  local_124 = uVar40 - 1;
  if (uVar2 < uVar9) {
    uVar44 = 0;
    uVar38 = 0;
    uVar11 = 0;
    do {
      uVar12 = (ulong)uVar9;
      uVar14 = uVar38;
      if (uVar11 < uVar38) {
        uVar14 = uVar11;
      }
      uVar16 = uVar12 + uVar14;
      puVar39 = (ulong *)(ip + uVar14);
      if ((dictMode == ZSTD_extDict) && (uVar16 < uVar18)) {
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)puVar39,local_108 + uVar12 + uVar14,iend,local_108 + uVar18,
                            pBVar4 + uVar18);
        uVar14 = sVar10 + uVar14;
        pBVar41 = pBVar4 + uVar12;
        if (uVar14 + uVar12 < uVar18) {
          pBVar41 = local_108 + uVar12;
        }
      }
      else {
        puVar25 = (ulong *)(pBVar4 + uVar12 + uVar14);
        puVar17 = puVar39;
        if (puVar39 < iend + -7) {
          if (*puVar25 == *puVar39) {
            lVar24 = 0;
            do {
              puVar17 = (ulong *)(ip + lVar24 + uVar14 + 8);
              if (iend + -7 <= puVar17) {
                puVar25 = (ulong *)(pBVar4 + uVar16 + lVar24 + 8);
                goto LAB_0014a188;
              }
              lVar8 = lVar24 + uVar16 + 8;
              lVar24 = lVar24 + 8;
            } while (*(ulong *)(pBVar4 + lVar8) == *puVar17);
            uVar15 = *puVar17 ^ *(ulong *)(pBVar4 + lVar8);
            uVar16 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar24;
          }
          else {
            uVar15 = *puVar39 ^ *puVar25;
            uVar16 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            uVar16 = uVar16 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0014a188:
          if ((puVar17 < iend + -3) && ((int)*puVar25 == (int)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 4);
            puVar25 = (ulong *)((long)puVar25 + 4);
          }
          if ((puVar17 < iend + -1) && ((short)*puVar25 == (short)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 2);
            puVar25 = (ulong *)((long)puVar25 + 2);
          }
          if (puVar17 < iend) {
            puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar25 == (char)*puVar17));
          }
          uVar16 = (long)puVar17 - (long)puVar39;
        }
        uVar14 = uVar16 + uVar14;
        pBVar41 = pBVar4 + uVar12;
      }
      if (uVar44 < uVar14) {
        if (local_a0 - uVar9 < uVar14) {
          local_a0 = (int)uVar14 + uVar9;
        }
        uVar29 = (uVar28 + 1) - uVar9;
        iVar36 = 0x1f;
        if (uVar29 != 0) {
          for (; uVar29 >> iVar36 == 0; iVar36 = iVar36 + -1) {
          }
        }
        uVar29 = (int)*offsetPtr + 1;
        iVar21 = 0x1f;
        if (uVar29 != 0) {
          for (; uVar29 >> iVar21 == 0; iVar21 = iVar21 + -1) {
          }
        }
        if (iVar36 - iVar21 < ((int)uVar14 - (int)uVar44) * 4) {
          *offsetPtr = (ulong)((uVar28 + 2) - uVar9);
          uVar44 = uVar14;
        }
        if (ip + uVar14 == iend) {
          if (dictMode == ZSTD_dictMatchState) {
            local_124 = 0;
          }
          goto LAB_0014a2f4;
        }
      }
      puVar23 = pUVar5 + (uVar9 & uVar35) * 2;
      if (pBVar41[uVar14] < ip[uVar14]) {
        *puVar27 = uVar9;
        if (uVar9 <= uVar30) {
          puVar27 = &local_60;
          goto LAB_0014a2f4;
        }
        puVar23 = puVar23 + 1;
        puVar27 = puVar23;
        uVar11 = uVar14;
      }
      else {
        *puVar26 = uVar9;
        uVar38 = uVar14;
        puVar26 = puVar23;
        if (uVar9 <= uVar30) {
          puVar26 = &local_60;
          goto LAB_0014a2f4;
        }
      }
      bVar45 = local_124 == 0;
      local_124 = local_124 + -1;
      if ((bVar45) || (uVar9 = *puVar23, uVar9 <= uVar2)) goto LAB_0014a2f4;
    } while( true );
  }
  uVar44 = 0;
LAB_0014a2f4:
  *puVar26 = 0;
  *puVar27 = 0;
  if ((dictMode == ZSTD_dictMatchState) && (local_124 != 0)) {
    pZVar6 = ms->dictMatchState;
    if ((uint)local_48 < 4) {
      sVar10 = (*(code *)(&DAT_0015e060 + *(int *)(&DAT_0015e060 + local_48 * 4)))
                         (&DAT_0015e060 + *(int *)(&DAT_0015e060 + local_48 * 4));
      return sVar10;
    }
    pBVar41 = (pZVar6->window).nextSrc;
    pBVar22 = (pZVar6->window).base;
    uVar38 = (long)pBVar41 - (long)pBVar22;
    uVar2 = (pZVar6->window).lowLimit;
    uVar30 = ~(-1 << ((char)(pZVar6->cParams).chainLog - 1U & 0x1f));
    iVar36 = (int)uVar38;
    uVar9 = iVar36 - uVar30;
    if (iVar36 - uVar2 <= uVar30) {
      uVar9 = uVar2;
    }
    uVar35 = pZVar6->hashTable
             [(uint)(*(int *)ip * -0x61c8864f) >> (-(char)(pZVar6->cParams).hashLog & 0x1fU)];
    if (uVar2 < uVar35) {
      uVar29 = (ms->window).dictLimit;
      uVar32 = (ms->window).lowLimit - iVar36;
      pUVar42 = pZVar6->chainTable;
      uVar18 = 0;
      local_f0 = 0;
      do {
        local_124 = local_124 + -1;
        uVar11 = uVar18;
        if (local_f0 < uVar18) {
          uVar11 = local_f0;
        }
        uVar14 = (ulong)uVar35;
        pBVar1 = pBVar22 + uVar14;
        sVar10 = ZSTD_count_2segments(ip + uVar11,pBVar1 + uVar11,iend,pBVar41,pBVar4 + uVar29);
        uVar11 = sVar10 + uVar11;
        pBVar34 = pBVar4 + uVar14 + uVar32;
        if (uVar11 + uVar14 < (uVar38 & 0xffffffff)) {
          pBVar34 = pBVar1;
        }
        if (uVar44 < uVar11) {
          iVar21 = uVar32 + uVar35;
          uVar37 = (uVar28 + 1) - iVar21;
          iVar36 = 0x1f;
          if (uVar37 != 0) {
            for (; uVar37 >> iVar36 == 0; iVar36 = iVar36 + -1) {
            }
          }
          uVar37 = (int)*offsetPtr + 1;
          iVar7 = 0x1f;
          if (uVar37 != 0) {
            for (; uVar37 >> iVar7 == 0; iVar7 = iVar7 + -1) {
            }
          }
          if (iVar36 - iVar7 < ((int)uVar11 - (int)uVar44) * 4) {
            *offsetPtr = (ulong)((uVar28 + 2) - iVar21);
            uVar44 = uVar11;
          }
          if (ip + uVar11 == iend) break;
        }
        puVar27 = pUVar42 + (uVar35 & uVar30) * 2;
        if (pBVar34[uVar11] < ip[uVar11]) {
          if (uVar35 <= uVar9) break;
          puVar27 = puVar27 + 1;
          local_f0 = uVar11;
        }
        else {
          uVar18 = uVar11;
          if (uVar35 <= uVar9) break;
        }
        if ((local_124 == 0) || (uVar35 = *puVar27, uVar35 <= uVar2)) break;
      } while( true );
    }
  }
  ms->nextToUpdate = local_a0 - 8;
  return uVar44;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offsetPtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ms->window.lowLimit;

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offsetPtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}